

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_144ada::SerialQueueImpl::~SerialQueueImpl(SerialQueueImpl *this)

{
  _Head_base<0UL,_std::thread_*,_false> _Var1;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  addOperation(this,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  std::thread::join();
  std::condition_variable::~condition_variable(&this->readyOperationsCondition);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&this->operations);
  _Var1._M_head_impl =
       (this->operationsThread)._M_t.
       super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
       super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
       super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (thread *)0x0) {
    if ((native_handle_type)(_Var1._M_head_impl)->_M_id != 0) {
      std::terminate();
    }
    operator_delete(_Var1._M_head_impl,8);
  }
  (this->operationsThread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

~SerialQueueImpl() {
    // Signal the worker to shut down.
    addOperation({});

    // Wait for the worker to complete.
    operationsThread->join();
  }